

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresultstore.cpp
# Opt level: O0

int __thiscall
QtPrivate::ResultStoreBase::insertResultItem(ResultStoreBase *this,int index,ResultItem *resultItem)

{
  long lVar1;
  undefined4 uVar2;
  ResultItem *pRVar3;
  ResultItem *in_RDX;
  int in_ESI;
  ResultStoreBase *in_RDI;
  long in_FS_OFFSET;
  int *in_stack_00000020;
  int storeIndex;
  ResultItem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_RDI->m_filterMode & 1U) == 0) || (in_ESI == -1)) || (in_ESI <= in_RDI->insertIndex)) {
    ResultItem::count(in_RDX);
    in_ESI = updateInsertIndex(in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                               (int)in_stack_ffffffffffffffc8);
    insertResultItemIfValid(in_RDI,in_ESI,in_stack_ffffffffffffffc8);
  }
  else {
    pRVar3 = QMap<int,_QtPrivate::ResultItem>::operator[]
                       ((QMap<int,_QtPrivate::ResultItem> *)resultItem,in_stack_00000020);
    uVar2 = *(undefined4 *)&in_RDX->field_0x4;
    pRVar3->m_count = in_RDX->m_count;
    *(undefined4 *)&pRVar3->field_0x4 = uVar2;
    pRVar3->result = in_RDX->result;
  }
  syncPendingResults((ResultStoreBase *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_ESI;
  }
  __stack_chk_fail();
}

Assistant:

int ResultStoreBase::insertResultItem(int index, ResultItem &resultItem)
{
    int storeIndex;
    if (m_filterMode && index != -1 && index > insertIndex) {
        pendingResults[index] = resultItem;
        storeIndex = index;
    } else {
        storeIndex = updateInsertIndex(index, resultItem.count());
        insertResultItemIfValid(storeIndex - filteredResults, resultItem);
    }
    syncPendingResults();
    return storeIndex;
}